

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex9.cpp
# Opt level: O2

void func_stack(void)

{
  ostream *poVar1;
  int one;
  
  std::operator<<((ostream *)&std::cout,"\nMemory addresses on stack:");
  poVar1 = std::operator<<((ostream *)&std::cout,"\n&one=");
  std::ostream::_M_insert<void_const*>(poVar1);
  stack_two();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"\nMemory addresses on stack called from func_stack:");
  stack_three();
  stack_two();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  func_static();
  return;
}

Assistant:

void func_stack()
{
	int one = 10000;
	/* Please note that addresses for &one, &two and &three differ
	 * only because stack_two is called from stack_one and
	 * stack_three is called from stack_two.
	 * If we call all thee function from func_stack
	 * the result will be different.
	 */
	std::cout << "\nMemory addresses on stack:";
	std::cout << "\n&one=" << &one;
	stack_two();
	std::cout << std::endl;

	/*
	 * Here you can see that address of &three is different
	 * when stack_three is invoked from func_stack and stack_two
	 */
	std::cout << "\nMemory addresses on stack called from func_stack:";
	stack_three();
	stack_two();
	std::cout << std::endl;

	// Static storage does not move like stack does
	func_static();
}